

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O1

void __thiscall application::Chat::Chat(Chat *this)

{
  wstring *pwVar1;
  pointer pwVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  wstring *pwVar6;
  
  (this->username_)._M_dataplus._M_p = (pointer)&(this->username_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)this,L"Unknown user",L"");
  (this->separator_)._M_dataplus._M_p = (pointer)&(this->separator_).field_2;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>((wstring *)&this->separator_,L": ",L"");
  pwVar1 = &this->prompt_;
  (this->prompt_)._M_dataplus._M_p = (pointer)&(this->prompt_).field_2;
  pwVar6 = pwVar1;
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)pwVar1,L"---------------\nEnter you message: ",L"");
  (this->input_)._M_dataplus._M_p = (pointer)&(this->input_).field_2;
  (this->input_)._M_string_length = 0;
  (this->input_).field_2._M_local_buf[0] = L'\0';
  *(undefined8 *)&(this->sendMessageCallback_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->sendMessageCallback_).super__Function_base._M_functor + 8) = 0;
  (this->sendMessageCallback_).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->sendMessageCallback_)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->beforeExiting_).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->beforeExiting_).super__Function_base._M_functor + 8) = 0;
  (this->beforeExiting_)._M_invoker =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/application/application.cpp:110:116)>
       ::_M_invoke;
  (this->beforeExiting_).super__Function_base._M_manager =
       std::
       _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/2-sha[P]P2P-chat/src/application/application.cpp:110:116)>
       ::_M_manager;
  (this->mut).super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 8) = 0;
  *(undefined8 *)((long)&(this->mut).super___mutex_base._M_mutex + 0x10) = 0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__prev = (__pthread_internal_list *)0x0;
  (this->mut).super___mutex_base._M_mutex.__data.__list.__next = (__pthread_internal_list *)0x0;
  this->promptLines_ = 1;
  uVar3 = (this->prompt_)._M_string_length;
  if (uVar3 != 0) {
    pwVar2 = (pwVar1->_M_dataplus)._M_p;
    iVar4 = 1;
    uVar5 = 0;
    do {
      if (pwVar2[uVar5] == L'\n') {
        iVar4 = iVar4 + 1;
        this->promptLines_ = iVar4;
        pwVar6 = (wstring *)(uVar5 & 0xffffffff);
      }
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
    uVar3 = (ulong)(uint)((int)uVar3 - (int)pwVar6);
  }
  this->promptLastLine_ = (int)uVar3;
  return;
}

Assistant:

Chat::Chat()
	: username_(L"Unknown user"), separator_(L": "), prompt_(L"---------------\nEnter you message: "), beforeExiting_([]() {})
{
	calcPrompt();
}